

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

char * phosg::fgets_abi_cxx11_(char *__s,int __n,FILE *__stream)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  reference this;
  char *pcVar3;
  size_t __n_00;
  size_type sVar4;
  io_error *this_00;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *items;
  undefined4 in_register_00000034;
  FILE *__stream_00;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  string local_a0;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blocks;
  
  __stream_00 = (FILE *)CONCAT44(in_register_00000034,__n);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__s;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&blocks);
  do {
    local_a0._M_dataplus._M_p._0_4_ = 0x100;
    local_a9 = (allocator<char>)0x0;
    this = ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           emplace_back<int,char>
                     ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&blocks,
                      (int *)&local_a0,(char *)&local_a9);
    pcVar3 = ::fgets((this->_M_dataplus)._M_p,(int)this->_M_string_length,__stream_00);
    if (pcVar3 == (char *)0x0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&blocks);
      iVar2 = feof(__stream_00);
      if (iVar2 == 0) {
        this_00 = (io_error *)__cxa_allocate_exception(0x20);
        iVar2 = fileno(__stream_00);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"cannot read from stream",&local_a9);
        io_error::io_error(this_00,iVar2,&local_a0);
        __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
      }
      goto LAB_0010e2a4;
    }
    pcVar3 = (this->_M_dataplus)._M_p;
    __n_00 = strlen(pcVar3);
  } while ((0xff < __n_00) && (pcVar3[0xff] != '\n'));
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (this,__n_00);
LAB_0010e2a4:
  sVar4 = ::std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&blocks);
  pbVar1 = local_a8;
  if (sVar4 == 1) {
    ::std::__cxx11::string::string
              (local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        blocks.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  else {
    join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_a8,(phosg *)&blocks,items);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&blocks);
  return (char *)pbVar1;
}

Assistant:

std::string fgets(FILE* f) {
  deque<std::string> blocks;
  for (;;) {
    std::string& block = blocks.emplace_back(0x100, '\0');
    if (!::fgets(block.data(), block.size(), f)) {
      blocks.pop_back();
      if (::feof(f)) {
        break;
      } else {
        throw io_error(fileno(f), "cannot read from stream");
      }
    }
    size_t block_bytes = strlen(block.c_str());
    if ((block_bytes < 0x100) || (block[0xFF] == '\n')) {
      block.resize(block_bytes);
      break; // The line ends at the end of this block
    }
  }

  if (blocks.size() == 1) {
    return std::move(blocks.front());
  } else {
    return join(blocks);
  }
}